

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void transfer_file_data(connection *conn)

{
  int len;
  ssize_t sVar1;
  int local_2030;
  undefined1 local_2018 [4];
  int n;
  char buf [8192];
  connection *conn_local;
  
  if ((conn->ns_conn->send_iobuf).len < 0x4001) {
    if (conn->cl < 0x2000) {
      local_2030 = (int)conn->cl;
    }
    else {
      local_2030 = 0x2000;
    }
    sVar1 = read((conn->endpoint).fd,local_2018,(long)local_2030);
    len = (int)sVar1;
    if (len < 1) {
      close_local_endpoint(conn);
    }
    else if (0 < len) {
      conn->cl = conn->cl - (long)len;
      ns_send(conn->ns_conn,local_2018,len);
      if (conn->cl < 1) {
        close_local_endpoint(conn);
      }
    }
  }
  return;
}

Assistant:

static void transfer_file_data(struct connection *conn) {
  char buf[IOBUF_SIZE];
  int n;

  // If output buffer is too big, don't send anything. Wait until
  // mongoose drains already buffered data to the client.
  if (conn->ns_conn->send_iobuf.len > sizeof(buf) * 2) return;

  // Do not send anyt
  n = read(conn->endpoint.fd, buf, conn->cl < (int64_t) sizeof(buf) ?
           (int) conn->cl : (int) sizeof(buf));

  if (n <= 0) {
    close_local_endpoint(conn);
  } else if (n > 0) {
    conn->cl -= n;
    ns_send(conn->ns_conn, buf, n);
    if (conn->cl <= 0) {
      close_local_endpoint(conn);
    }
  }
}